

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O2

deBool dePoolArray_reserve(dePoolArray *arr,int size)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  int iVar5;
  void *newPage;
  ulong uVar6;
  void **ppvVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  uVar11 = arr->capacity;
  if ((int)uVar11 <= size) {
    iVar8 = size + 0xf >> 4;
    if (arr->pageTableCapacity < iVar8) {
      iVar1 = arr->pageTableCapacity * 2;
      if (iVar1 <= iVar8) {
        iVar1 = iVar8;
      }
      ppvVar3 = (void **)deMemPool_alloc(arr->pool,(long)iVar1 * 8);
      if (ppvVar3 == (void **)0x0) {
        return 0;
      }
      uVar11 = arr->pageTableCapacity;
      uVar10 = 0;
      uVar6 = 0;
      if (0 < (int)uVar11) {
        uVar6 = (ulong)uVar11;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        ppvVar3[uVar10] = arr->pageTable[uVar10];
      }
      for (; (long)uVar6 < (long)iVar1; uVar6 = uVar6 + 1) {
        ppvVar3[uVar6] = (void *)0x0;
      }
      ppvVar7 = arr->pageTable;
      iVar5 = uVar11 << 3;
      arr->pageTable = ppvVar3;
      arr->pageTableCapacity = iVar1;
      uVar11 = arr->capacity;
    }
    else {
      iVar5 = 0;
      ppvVar7 = (void **)0x0;
    }
    iVar1 = arr->elementSize;
    iVar2 = iVar1 * 0x10;
    iVar9 = (int)uVar11 >> 4;
    uVar11 = uVar11 & 0xfffffff0;
    while( true ) {
      lVar12 = (long)iVar9;
      if (iVar5 < iVar2) break;
      iVar9 = iVar9 + 1;
      arr->pageTable[lVar12] = ppvVar7;
      ppvVar7 = (void **)((long)ppvVar7 + (long)iVar2);
      uVar11 = uVar11 + 0x10;
      iVar5 = iVar5 + iVar1 * -0x10;
    }
    for (; lVar12 < iVar8; lVar12 = lVar12 + 1) {
      pvVar4 = deMemPool_alloc(arr->pool,(long)iVar2);
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      arr->pageTable[lVar12] = pvVar4;
      uVar11 = uVar11 + 0x10;
    }
    arr->capacity = uVar11;
  }
  return 1;
}

Assistant:

deBool			dePoolArray_reserve			(dePoolArray* arr, int size)
{
	if (size >= arr->capacity)
	{
		void*	oldPageTable			= DE_NULL;
		int		oldPageTableSize		= 0;

		int		newCapacity				= deAlign32(size, 1 << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2);
		int		reqPageTableCapacity	= newCapacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

		if (arr->pageTableCapacity < reqPageTableCapacity)
		{
			int		newPageTableCapacity	= deMax32(2*arr->pageTableCapacity, reqPageTableCapacity);
			void**	newPageTable			= (void**)deMemPool_alloc(arr->pool, (size_t)newPageTableCapacity * sizeof(void*));
			int		i;

			if (!newPageTable)
				return DE_FALSE;

			for (i = 0; i < arr->pageTableCapacity; i++)
				newPageTable[i] = arr->pageTable[i];

			for (; i < newPageTableCapacity; i++)
				newPageTable[i] = DE_NULL;

			/* Grab information about old page table for recycling purposes. */
			oldPageTable		= arr->pageTable;
			oldPageTableSize	= arr->pageTableCapacity * (int)sizeof(void*);

			arr->pageTable			= newPageTable;
			arr->pageTableCapacity	= newPageTableCapacity;
		}

		/* Allocate new pages. */
		{
			int pageAllocSize = arr->elementSize << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			int pageTableNdx = arr->capacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

			/* Allocate new pages from recycled old page table. */
			while (oldPageTableSize >= pageAllocSize)
			{
				void* newPage = oldPageTable;
				DE_ASSERT(arr->pageTableCapacity > pageTableNdx); /* \todo [petri] is this always true? */
				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx++] = newPage;

				oldPageTable = (void*)((deUint8*)oldPageTable + pageAllocSize);
				oldPageTableSize -= pageAllocSize;
			}

			/* Allocate the rest of the needed pages from the pool. */
			for (; pageTableNdx < reqPageTableCapacity; pageTableNdx++)
			{
				void* newPage = deMemPool_alloc(arr->pool, (size_t)pageAllocSize);
				if (!newPage)
					return DE_FALSE;

				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx] = newPage;
			}

			arr->capacity = pageTableNdx << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			DE_ASSERT(arr->capacity >= newCapacity);
		}
	}

	return DE_TRUE;
}